

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O0

int demoDirectWrite(DemoFile *p,void *zBuf,int iAmt,unqlite_int64 iOfst)

{
  __off_t _Var1;
  ssize_t sVar2;
  size_t nWrite;
  off_t ofst;
  unqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  DemoFile *p_local;
  
  _Var1 = lseek(p->fd,iOfst,0);
  if (_Var1 == iOfst) {
    sVar2 = write(p->fd,zBuf,(long)iAmt);
    if (sVar2 == iAmt) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -2;
    }
  }
  else {
    p_local._4_4_ = -2;
  }
  return p_local._4_4_;
}

Assistant:

static int demoDirectWrite(
  DemoFile *p,                    /* File handle */
  const void *zBuf,               /* Buffer containing data to write */
  int iAmt,                       /* Size of data to write in bytes */
  unqlite_int64 iOfst             /* File offset to write to */
  ){
#if defined(_MSC_VER) || defined(__MINGW32__)
  __int64
#else
  off_t
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
    ofst;                         /* Return value from lseek() */
  size_t nWrite;                  /* Return value from write() */

  ofst = lseek(p->fd, iOfst, SEEK_SET);
  if( ofst!=iOfst ){
    return UNQLITE_IOERR;
  }

  nWrite = write(p->fd, zBuf, iAmt);
  if( nWrite!=iAmt ){
    return UNQLITE_IOERR;
  }

  return UNQLITE_OK;
}